

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result_conflict *
validateInnerProductWeightsBias
          (Result_conflict *__return_storage_ptr__,NeuralNetworkLayer *layer,WeightParams *weights,
          WeightParams *bias)

{
  __aligned_membuf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  _Var1;
  WeightParams *pWVar2;
  bool bVar3;
  LayerCase LVar4;
  int iVar5;
  string *psVar6;
  RepeatedField<float> *pRVar7;
  uint64_t expectedUnits;
  ulong uVar8;
  string err_1;
  undefined1 local_518 [80];
  undefined1 local_4c8 [32];
  undefined1 local_4a8 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  string local_3e8;
  uint64_t bias_size;
  undefined1 local_3b8 [32];
  undefined1 local_398 [40];
  undefined1 local_370 [32];
  undefined1 local_350 [32];
  undefined1 local_330 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  undefined1 local_1f0 [72];
  ulong local_1a8;
  uint64_t weight_size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  undefined1 local_160 [72];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 local_d8 [76];
  WeightParamType local_8c;
  WeightParamType local_88;
  WeightParamType biasValueType;
  WeightParamType weightsValueType;
  BatchedMatMulLayerParams *params_1;
  InnerProductLayerParams *params;
  string local_60;
  uint64_t num_outputs;
  uint64_t num_inputs;
  bool has_bias;
  WeightParams *pWStack_28;
  WeightParams *bias_local;
  WeightParams *weights_local;
  NeuralNetworkLayer *layer_local;
  Result_conflict *r;
  
  num_inputs._7_1_ = 0;
  pWStack_28 = bias;
  bias_local = weights;
  weights_local = (WeightParams *)layer;
  layer_local = (NeuralNetworkLayer *)__return_storage_ptr__;
  CoreML::Result::Result((Result *)__return_storage_ptr__);
  std::__cxx11::string::string((string *)&local_60);
  LVar4 = CoreML::Specification::NeuralNetworkLayer::layer_case((NeuralNetworkLayer *)weights_local)
  ;
  if (LVar4 == kInnerProduct) {
    params_1 = (BatchedMatMulLayerParams *)
               CoreML::Specification::NeuralNetworkLayer::innerproduct
                         ((NeuralNetworkLayer *)weights_local);
    num_outputs = CoreML::Specification::InnerProductLayerParams::inputchannels
                            ((InnerProductLayerParams *)params_1);
    local_60._M_storage._M_storage =
         (uchar  [8])
         CoreML::Specification::InnerProductLayerParams::outputchannels
                   ((InnerProductLayerParams *)params_1);
    num_inputs._6_1_ =
         CoreML::Specification::InnerProductLayerParams::hasbias
                   ((InnerProductLayerParams *)params_1);
    std::__cxx11::string::operator=((string *)&local_60,"Inner product");
  }
  else {
    if (LVar4 != kBatchedMatmul) {
      num_inputs._7_1_ = 1;
      biasValueType = FLOAT16;
      goto LAB_003f98ab;
    }
    _weightsValueType =
         CoreML::Specification::NeuralNetworkLayer::batchedmatmul
                   ((NeuralNetworkLayer *)weights_local);
    num_outputs = CoreML::Specification::BatchedMatMulLayerParams::weightmatrixfirstdimension
                            (_weightsValueType);
    local_60._M_storage._M_storage =
         (uchar  [8])
         CoreML::Specification::BatchedMatMulLayerParams::weightmatrixseconddimension
                   (_weightsValueType);
    num_inputs._6_1_ = CoreML::Specification::BatchedMatMulLayerParams::hasbias(_weightsValueType);
    std::__cxx11::string::operator=((string *)&local_60,"BatchedMatMul");
  }
  local_88 = CoreML::valueType(bias_local);
  local_8c = CoreML::valueType(pWStack_28);
  pWVar2 = bias_local;
  _Var1._M_storage = local_60._M_storage._M_storage;
  if ((local_88 == UNSPECIFIED) || (((num_inputs._6_1_ & 1) != 0 && (local_8c == UNSPECIFIED)))) {
    std::operator+(&local_118,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_60,
                   " layer \'");
    psVar6 = CoreML::Specification::NeuralNetworkLayer::name_abi_cxx11_
                       ((NeuralNetworkLayer *)weights_local);
    std::operator+(&local_f8,&local_118,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar6);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                   &local_f8,"\' has invalid weights/bias fields.");
    CoreML::Result::Result((Result *)(local_d8 + 0x20),INVALID_MODEL_PARAMETERS,(string *)local_d8);
    CoreML::Result::operator=((Result *)__return_storage_ptr__,(Result *)(local_d8 + 0x20));
    CoreML::Result::~Result((Result *)(local_d8 + 0x20));
    std::__cxx11::string::~string((string *)local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    num_inputs._7_1_ = 1;
    biasValueType = FLOAT16;
  }
  else if (((num_inputs._6_1_ & 1) == 0) ||
          (((local_88 != FLOAT16 || (local_8c != FLOAT32)) &&
           ((local_88 != FLOAT32 || (local_8c != FLOAT16)))))) {
    local_1a8 = 0;
    if ((local_88 == FLOAT32) || (local_88 == FLOAT16)) {
      if (local_88 == FLOAT32) {
        pRVar7 = CoreML::Specification::WeightParams::floatvalue(bias_local);
        iVar5 = google::protobuf::RepeatedField<float>::size(pRVar7);
        local_1a8 = (ulong)iVar5;
      }
      else {
        CoreML::Specification::WeightParams::float16value_abi_cxx11_(bias_local);
        local_1a8 = std::__cxx11::string::size();
        local_1a8 = local_1a8 >> 1;
      }
      if (num_outputs * (long)local_60._M_storage._M_storage - local_1a8 != 0) {
        psVar6 = CoreML::Specification::NeuralNetworkLayer::name_abi_cxx11_
                           ((NeuralNetworkLayer *)weights_local);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_330 + 0x20),"Layer \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar6);
        std::operator+(&local_2f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_330 + 0x20)," has incorrect weight matrix size ");
        std::__cxx11::to_string((string *)local_330,local_1a8);
        std::operator+(&local_2d0,&local_2f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_330);
        std::operator+(&local_2b0,&local_2d0," to encode a ");
        std::__cxx11::to_string((string *)local_350,num_outputs);
        std::operator+(&local_290,&local_2b0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_350);
        std::operator+(&local_270,&local_290,anon_var_dwarf_23898b);
        std::__cxx11::to_string((string *)local_370,(unsigned_long)local_60._M_storage._M_storage);
        std::operator+(&local_250,&local_270,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_370);
        std::operator+(&local_230,&local_250," ");
        std::operator+(&local_210,&local_230,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_60);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f0,&local_210,".");
        CoreML::Result::Result
                  ((Result *)(local_1f0 + 0x20),INVALID_MODEL_PARAMETERS,(string *)local_1f0);
        CoreML::Result::operator=((Result *)__return_storage_ptr__,(Result *)(local_1f0 + 0x20));
        CoreML::Result::~Result((Result *)(local_1f0 + 0x20));
        std::__cxx11::string::~string((string *)local_1f0);
        std::__cxx11::string::~string((string *)&local_210);
        std::__cxx11::string::~string((string *)&local_230);
        std::__cxx11::string::~string((string *)&local_250);
        std::__cxx11::string::~string((string *)local_370);
        std::__cxx11::string::~string((string *)&local_270);
        std::__cxx11::string::~string((string *)&local_290);
        std::__cxx11::string::~string((string *)local_350);
        std::__cxx11::string::~string((string *)&local_2b0);
        std::__cxx11::string::~string((string *)&local_2d0);
        std::__cxx11::string::~string((string *)local_330);
        std::__cxx11::string::~string((string *)&local_2f0);
        std::__cxx11::string::~string((string *)(local_330 + 0x20));
        num_inputs._7_1_ = 1;
        biasValueType = FLOAT16;
        goto LAB_003f98ab;
      }
    }
    else if (local_88 == QUINT) {
      expectedUnits = num_outputs * (long)local_60._M_storage._M_storage;
      psVar6 = CoreML::Specification::NeuralNetworkLayer::name_abi_cxx11_
                         ((NeuralNetworkLayer *)weights_local);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_3b8,"weight",(allocator *)((long)&bias_size + 7))
      ;
      CoreML::validateGeneralWeightParams
                ((Result_conflict *)local_398,pWVar2,expectedUnits,(uint64_t)_Var1._M_storage,
                 &local_60,psVar6,(string *)local_3b8);
      CoreML::Result::operator=((Result *)__return_storage_ptr__,(Result *)local_398);
      CoreML::Result::~Result((Result *)local_398);
      std::__cxx11::string::~string((string *)local_3b8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&bias_size + 7));
      bVar3 = CoreML::Result::good((Result *)__return_storage_ptr__);
      if (!bVar3) {
        num_inputs._7_1_ = 1;
        biasValueType = FLOAT16;
        goto LAB_003f98ab;
      }
    }
    pWVar2 = pWStack_28;
    _Var1._M_storage = local_60._M_storage._M_storage;
    local_3e8._M_storage._M_storage[0] = '\0';
    local_3e8._M_storage._M_storage[1] = '\0';
    local_3e8._M_storage._M_storage[2] = '\0';
    local_3e8._M_storage._M_storage[3] = '\0';
    local_3e8._M_storage._M_storage[4] = '\0';
    local_3e8._M_storage._M_storage[5] = '\0';
    local_3e8._M_storage._M_storage[6] = '\0';
    local_3e8._M_storage._M_storage[7] = '\0';
    if ((num_inputs._6_1_ & 1) != 0) {
      if ((local_8c == FLOAT32) || (local_8c == FLOAT16)) {
        if (local_8c == FLOAT32) {
          pRVar7 = CoreML::Specification::WeightParams::floatvalue(pWStack_28);
          iVar5 = google::protobuf::RepeatedField<float>::size(pRVar7);
          local_3e8._M_storage._M_storage = (uchar  [8])(long)iVar5;
        }
        else {
          CoreML::Specification::WeightParams::float16value_abi_cxx11_(pWStack_28);
          uVar8 = std::__cxx11::string::size();
          local_3e8._M_storage._M_storage = (uchar  [8])(uVar8 >> 1);
        }
        if (local_3e8._M_storage._M_storage != local_60._M_storage._M_storage) {
          psVar6 = CoreML::Specification::NeuralNetworkLayer::name_abi_cxx11_
                             ((NeuralNetworkLayer *)weights_local);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_4a8 + 0x20),"Layer \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar6
                        );
          std::operator+(&local_468,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_4a8 + 0x20),"\' has incorrect bias vector size ");
          std::__cxx11::to_string
                    ((string *)local_4a8,(unsigned_long)local_3e8._M_storage._M_storage);
          std::operator+(&local_448,&local_468,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4a8);
          std::operator+(&local_428,&local_448," (expected ");
          std::__cxx11::to_string((string *)local_4c8,(unsigned_long)local_60._M_storage._M_storage)
          ;
          std::operator+(&local_408,&local_428,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4c8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_3e8,&local_408,").");
          std::__cxx11::string::~string((string *)&local_408);
          std::__cxx11::string::~string((string *)local_4c8);
          std::__cxx11::string::~string((string *)&local_428);
          std::__cxx11::string::~string((string *)&local_448);
          std::__cxx11::string::~string((string *)local_4a8);
          std::__cxx11::string::~string((string *)&local_468);
          std::__cxx11::string::~string((string *)(local_4a8 + 0x20));
          CoreML::Result::Result((Result *)(local_518 + 0x28),INVALID_MODEL_PARAMETERS,&local_3e8);
          CoreML::Result::operator=((Result *)__return_storage_ptr__,(Result *)(local_518 + 0x28));
          CoreML::Result::~Result((Result *)(local_518 + 0x28));
          num_inputs._7_1_ = 1;
          biasValueType = FLOAT16;
          std::__cxx11::string::~string((string *)&local_3e8);
          goto LAB_003f98ab;
        }
      }
      else if (local_8c == QUINT) {
        psVar6 = CoreML::Specification::NeuralNetworkLayer::name_abi_cxx11_
                           ((NeuralNetworkLayer *)weights_local);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&err_1._M_storage,"bias",
                   (allocator *)((long)&err_1.super__Rb_tree_node_base._M_right + 7));
        CoreML::validateGeneralWeightParams
                  ((Result_conflict *)local_518,pWVar2,(uint64_t)_Var1._M_storage,1,&local_60,psVar6
                   ,(string *)&err_1._M_storage);
        CoreML::Result::operator=((Result *)__return_storage_ptr__,(Result *)local_518);
        CoreML::Result::~Result((Result *)local_518);
        std::__cxx11::string::~string((string *)&err_1._M_storage);
        std::allocator<char>::~allocator
                  ((allocator<char> *)((long)&err_1.super__Rb_tree_node_base._M_right + 7));
        bVar3 = CoreML::Result::good((Result *)__return_storage_ptr__);
        if (!bVar3) {
          num_inputs._7_1_ = 1;
          biasValueType = FLOAT16;
          goto LAB_003f98ab;
        }
      }
    }
    num_inputs._7_1_ = 1;
    biasValueType = FLOAT16;
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&weight_size
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_60,
                   " layer \'");
    psVar6 = CoreML::Specification::NeuralNetworkLayer::name_abi_cxx11_
                       ((NeuralNetworkLayer *)weights_local);
    std::operator+(&local_180,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&weight_size
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar6);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160,
                   &local_180,
                   "has unmatched precisions of weights/bias They should either be half or full precision."
                  );
    CoreML::Result::Result
              ((Result *)(local_160 + 0x20),INVALID_MODEL_PARAMETERS,(string *)local_160);
    CoreML::Result::operator=((Result *)__return_storage_ptr__,(Result *)(local_160 + 0x20));
    CoreML::Result::~Result((Result *)(local_160 + 0x20));
    std::__cxx11::string::~string((string *)local_160);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&weight_size);
    num_inputs._7_1_ = 1;
    biasValueType = FLOAT16;
  }
LAB_003f98ab:
  std::__cxx11::string::~string((string *)&local_60);
  if ((num_inputs._7_1_ & 1) == 0) {
    CoreML::Result::~Result((Result *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static Result validateInnerProductWeightsBias(const Specification::NeuralNetworkLayer& layer,
                                              const Specification::WeightParams& weights,
                                              const Specification::WeightParams& bias) {

    Result r;

    bool has_bias;
    uint64_t num_inputs;
    uint64_t num_outputs;
    std::string layer_type;

    switch(layer.layer_case()) {
        case Specification::NeuralNetworkLayer::LayerCase::kInnerProduct: {
            const auto& params = layer.innerproduct();
            num_inputs = params.inputchannels();
            num_outputs = params.outputchannels();
            has_bias = params.hasbias();
            layer_type = "Inner product";
            break;
        }
        case Specification::NeuralNetworkLayer::LayerCase::kBatchedMatmul: {
            const auto& params = layer.batchedmatmul();
            num_inputs = params.weightmatrixfirstdimension();
            num_outputs = params.weightmatrixseconddimension();
            has_bias = params.hasbias();
            layer_type = "BatchedMatMul";
            break;
        }
        default:
            return r;
    }

    WeightParamType weightsValueType, biasValueType;
    weightsValueType = valueType(weights);
    biasValueType = valueType(bias);

    // Check for weight and bias value type
    if ((weightsValueType == UNSPECIFIED) || (has_bias && biasValueType == UNSPECIFIED)) {
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, layer_type + " layer '" + layer.name() + "' has invalid weights/bias fields.");
        return r;
    }
    // Check that weight and bias should both be FP16/32, or quantized
    if (has_bias){
        if ((weightsValueType == CoreML::FLOAT16 && biasValueType == CoreML::FLOAT32) ||
            (weightsValueType == CoreML::FLOAT32 && biasValueType == CoreML::FLOAT16)){
            r = Result(ResultType::INVALID_MODEL_PARAMETERS, layer_type + " layer '" + layer.name() +
                       "has unmatched precisions of weights/bias They should either be half or full precision.");
            return r;
        }
    }

    // Check weights
    uint64_t weight_size = 0;
    if (weightsValueType == FLOAT32 || weightsValueType == FLOAT16){
        if (weightsValueType == FLOAT32) {
            weight_size = static_cast<uint64_t>(weights.floatvalue().size());
        } else {
            weight_size = static_cast<uint64_t>(weights.float16value().size() / 2);
        }
        if (num_inputs * num_outputs != weight_size) {
            r = Result(ResultType::INVALID_MODEL_PARAMETERS, "Layer '" + layer.name() +
                       " has incorrect weight matrix size " + std::to_string(weight_size) +
                       " to encode a " + std::to_string(num_inputs) + " × " +
                       std::to_string(num_outputs) + " " + layer_type + ".");
            return r;
        }
    } else if (weightsValueType == QUINT){
        r = validateGeneralWeightParams(weights, num_inputs * num_outputs, num_outputs,
                                        layer_type, layer.name(), "weight");
        if (!r.good()) return r;
    }

    // Check the bias
    uint64_t bias_size = 0;
    if (has_bias){
        if (biasValueType == FLOAT32 || biasValueType == FLOAT16){
            if (biasValueType == FLOAT32){
                bias_size = static_cast<uint64_t>(bias.floatvalue().size());
            } else {
                bias_size = static_cast<uint64_t>(bias.float16value().size() / 2);
            }
            if (bias_size != num_outputs) {
                std::string err = "Layer '" + layer.name() + "' has incorrect bias vector size " +
                std::to_string(bias_size) + " (expected " + std::to_string(num_outputs) + ").";
                r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                return r;
            }
        } else if (biasValueType == QUINT){
            r = validateGeneralWeightParams(bias, num_outputs, 1, layer_type,
                                            layer.name(), "bias");
            if (!r.good()) return r;
        }
    } else if (!has_bias && bias_size > 0) {
        std::string err = "Bias vector being ignored since \"hasBias\" flag not set.";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }

    return r;
}